

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O1

void __thiscall BasicTestingSetup::~BasicTestingSetup(BasicTestingSetup *this)

{
  _Head_base<0UL,_kernel::Context_*,_false> _Var1;
  Logger *this_00;
  long in_FS_OFFSET;
  char *local_70;
  path local_68;
  path local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>::reset
            ((__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_> *)
             &(this->m_node).ecc_context,(pointer)0x0);
  _Var1._M_head_impl =
       (this->m_node).kernel._M_t.
       super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
       super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
       super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl;
  (this->m_node).kernel._M_t.
  super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
  super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
  super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl = (Context *)0x0;
  if (_Var1._M_head_impl != (Context *)0x0) {
    operator_delete(_Var1._M_head_impl,1);
  }
  SetMockTime((seconds)0x0);
  this_00 = LogInstance();
  BCLog::Logger::DisconnectTestLogger(this_00);
  if (this->m_has_custom_datadir == true) {
    local_70 = ".lock";
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_40,&local_70,auto_format);
    UnlockDirectory(&this->m_path_lock,(path *)&local_40);
    std::filesystem::__cxx11::path::~path(&local_40);
    std::filesystem::__cxx11::path::path(&local_68,&(this->m_path_lock).super_path);
    std::filesystem::__cxx11::path::_M_append(&local_68,5,".lock");
    std::filesystem::__cxx11::path::path(&local_40,&local_68);
    std::filesystem::remove(&local_40);
    std::filesystem::__cxx11::path::~path(&local_40);
    std::filesystem::__cxx11::path::~path(&local_68);
  }
  else {
    std::filesystem::remove_all(&(this->m_path_root).super_path);
  }
  ArgsManager::ClearArgs(&gArgs);
  ArgsManager::~ArgsManager(&this->m_args);
  std::filesystem::__cxx11::path::~path(&(this->m_path_lock).super_path);
  std::filesystem::__cxx11::path::~path(&(this->m_path_root).super_path);
  ChaCha20::~ChaCha20(&(this->m_rng).rng);
  ::node::NodeContext::~NodeContext(&this->m_node);
  TokenPipeEnd::~TokenPipeEnd(&(this->m_interrupt).m_pipe_w);
  TokenPipeEnd::~TokenPipeEnd(&(this->m_interrupt).m_pipe_r);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BasicTestingSetup::~BasicTestingSetup()
{
    m_node.ecc_context.reset();
    m_node.kernel.reset();
    SetMockTime(0s); // Reset mocktime for following tests
    LogInstance().DisconnectTestLogger();
    if (m_has_custom_datadir) {
        // Only remove the lock file, preserve the data directory.
        UnlockDirectory(m_path_lock, ".lock");
        fs::remove(m_path_lock / ".lock");
    } else {
        fs::remove_all(m_path_root);
    }
    gArgs.ClearArgs();
}